

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Block * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Block *b)

{
  bool bVar1;
  reference s_00;
  pool_ref<soul::AST::Statement> *s;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
  *__range2;
  Block *b_local;
  RewritingASTVisitor *this_local;
  
  __end2 = std::
           vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
           ::begin(&b->statements);
  s = (pool_ref<soul::AST::Statement> *)
      std::
      vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
      ::end(&b->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                                *)&s);
    if (!bVar1) break;
    s_00 = __gnu_cxx::
           __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
           ::operator*(&__end2);
    replaceStatement(this,s_00);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
    ::operator++(&__end2);
  }
  return b;
}

Assistant:

virtual AST::Block& visit (AST::Block& b)
    {
        for (auto& s : b.statements)
            replaceStatement (s);

        return b;
    }